

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

Hop_Obj_t *
Abc_NodeIfToHop2_rec(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited)

{
  If_Obj_t **ppIVar1;
  uint uVar2;
  int iVar3;
  void **ppvVar4;
  Hop_Obj_t *pHVar5;
  Hop_Obj_t *pHVar6;
  If_Obj_t *pIVar7;
  
  if (*(Hop_Obj_t **)&pIfObj->CutBest != (Hop_Obj_t *)0x0) {
    return *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  uVar2 = vVisited->nSize;
  if (uVar2 == vVisited->nCap) {
    if ((int)uVar2 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar4;
      vVisited->nCap = 0x10;
    }
    else {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(vVisited->pArray,(ulong)uVar2 << 4);
      }
      vVisited->pArray = ppvVar4;
      vVisited->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar4 = vVisited->pArray;
  }
  iVar3 = vVisited->nSize;
  vVisited->nSize = iVar3 + 1;
  ppvVar4[iVar3] = &pIfObj->CutBest;
  (pIfObj->CutBest).Area = 1.4013e-45;
  (pIfObj->CutBest).Edge = 0.0;
  pHVar5 = (Hop_Obj_t *)0x1;
  pIVar7 = pIfObj;
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
    do {
      pHVar5 = Abc_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar7->pFanin0,vVisited);
      if ((pHVar5 != (Hop_Obj_t *)0x1) &&
         (pHVar6 = Abc_NodeIfToHop2_rec(pHopMan,pIfMan,pIVar7->pFanin1,vVisited),
         pHVar6 != (Hop_Obj_t *)0x1)) {
        pHVar6 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)(*(uint *)pIVar7 >> 4 & 1) ^ (ulong)pHVar5),
                         (Hop_Obj_t *)((ulong)(*(uint *)pIVar7 >> 5 & 1) ^ (ulong)pHVar6));
        pHVar5 = (Hop_Obj_t *)((ulong)pHVar6 ^ 1);
        if (((*(uint *)pIfObj ^ *(uint *)pIVar7) & 0x40) == 0) {
          pHVar5 = pHVar6;
        }
        *(Hop_Obj_t **)&pIfObj->CutBest = pHVar5;
        return pHVar5;
      }
      ppIVar1 = &pIVar7->pEquiv;
      pIVar7 = *ppIVar1;
    } while (*ppIVar1 != (If_Obj_t *)0x0);
    pHVar5 = *(Hop_Obj_t **)&pIfObj->CutBest;
  }
  return pHVar5;
}

Assistant:

Hop_Obj_t * Abc_NodeIfToHop2_rec( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutData(pCut) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetData( pCut, (void *)1 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return (Hop_Obj_t *)If_CutData(pCut);
    // compute the functions of the children
    for ( pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv )
    {
        gFunc0 = Abc_NodeIfToHop2_rec( pHopMan, pIfMan, pTemp->pFanin0, vVisited );
        if ( gFunc0 == (void *)1 )
            continue;
        gFunc1 = Abc_NodeIfToHop2_rec( pHopMan, pIfMan, pTemp->pFanin1, vVisited );
        if ( gFunc1 == (void *)1 )
            continue;
        // both branches are solved
        gFunc = Hop_And( pHopMan, Hop_NotCond(gFunc0, pTemp->fCompl0), Hop_NotCond(gFunc1, pTemp->fCompl1) ); 
        if ( pTemp->fPhase != pIfObj->fPhase )
            gFunc = Hop_Not(gFunc);
        If_CutSetData( pCut, gFunc );
        break;
    }
    return (Hop_Obj_t *)If_CutData(pCut);
}